

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

int __thiscall
Centaurus::CATNMachine<unsigned_char>::import_regular_terminal
          (CATNMachine<unsigned_char> *this,NFA<unsigned_char> *nfa,int origin,int tag)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  NFABaseState<unsigned_char,_int> *pNVar4;
  int local_58;
  int i;
  CharClass<unsigned_char> local_48;
  int local_24;
  int local_20;
  int offset;
  int tag_local;
  int origin_local;
  NFA<unsigned_char> *nfa_local;
  CATNMachine<unsigned_char> *this_local;
  
  local_20 = tag;
  offset = origin;
  _tag_local = &nfa->super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>;
  nfa_local = (NFA<unsigned_char> *)this;
  sVar2 = std::
          vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
          ::size(&this->m_nodes);
  local_24 = (int)sVar2;
  CharClass<unsigned_char>::CharClass(&local_48);
  add_node(this,&local_48,offset,local_20);
  CharClass<unsigned_char>::~CharClass(&local_48);
  pvVar3 = std::
           vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
           ::back(&this->m_nodes);
  pNVar4 = NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::get_state(_tag_local,0);
  CATNNode<unsigned_char>::import_transitions(pvVar3,pNVar4,local_24);
  local_58 = 1;
  while( true ) {
    iVar1 = NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::get_state_num(_tag_local);
    if (iVar1 <= local_58) break;
    std::
    vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
    ::emplace_back<>(&this->m_nodes);
    pvVar3 = std::
             vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
             ::back(&this->m_nodes);
    pNVar4 = NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::get_state(_tag_local,local_58);
    CATNNode<unsigned_char>::import_transitions(pvVar3,pNVar4,local_24);
    local_58 = local_58 + 1;
  }
  sVar2 = std::
          vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
          ::size(&this->m_nodes);
  return (int)sVar2 + -1;
}

Assistant:

int import_regular_terminal(const NFA<TCHAR>& nfa, int origin, int tag)
    {
        int offset = m_nodes.size();
        add_node(CharClass<TCHAR>(), origin, tag);
        m_nodes.back().import_transitions(nfa.get_state(0), offset);
        for (int i = 1; i < nfa.get_state_num(); i++)
        {
            m_nodes.emplace_back();
            m_nodes.back().import_transitions(nfa.get_state(i), offset);
        }
        return m_nodes.size() - 1;
    }